

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::unkeyframe(Mesh *this,double t)

{
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).positions,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).rotations,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).scales,t,0.1);
  if (this->skeleton != (Skeleton *)0x0) {
    Skeleton::unkeyframe(this->skeleton,t);
    return;
  }
  return;
}

Assistant:

void Mesh::unkeyframe(double t) {
  positions.removeKnot(t, 0.1);
  rotations.removeKnot(t, 0.1);
  scales.removeKnot(t, 0.1);
  if (skeleton) skeleton->unkeyframe(t);
}